

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O1

void __thiscall yyFlexLexer::yy_load_buffer_state(yyFlexLexer *this)

{
  yy_buffer_state *pyVar1;
  char *pcVar2;
  
  pyVar1 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  this->yy_n_chars = pyVar1->yy_n_chars;
  pcVar2 = pyVar1->yy_buf_pos;
  this->yy_c_buf_p = pcVar2;
  (this->super_FlexLexer).yytext = pcVar2;
  std::ios::rdbuf((streambuf *)(&this->yyin + *(long *)(*(long *)&this->yyin + -0x18)));
  this->yy_hold_char = *this->yy_c_buf_p;
  return;
}

Assistant:

void yyFlexLexer::yy_load_buffer_state()
/* %endif */
{
    	(yy_n_chars) = YY_CURRENT_BUFFER_LVALUE->yy_n_chars;
	(yytext_ptr) = (yy_c_buf_p) = YY_CURRENT_BUFFER_LVALUE->yy_buf_pos;
/* %if-c-only */
/* %endif */
/* %if-c++-only */
	yyin.rdbuf(YY_CURRENT_BUFFER_LVALUE->yy_input_file);
/* %endif */
	(yy_hold_char) = *(yy_c_buf_p);
}